

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

Tag embree::SceneGraph::typeTagOfString(string *ty)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string local_30 [44];
  Tag local_4;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_4 = PTY_CHAR;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_4 = PTY_CHAR;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
      if (bVar1) {
        local_4 = PTY_UCHAR;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
        if (bVar1) {
          local_4 = PTY_UCHAR;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8);
          if (bVar1) {
            local_4 = PTY_SHORT;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                                    ,in_stack_ffffffffffffffb8);
            if (bVar1) {
              local_4 = PTY_SHORT;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                      in_stack_ffffffffffffffb8);
              if (bVar1) {
                local_4 = PTY_USHORT;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                        in_stack_ffffffffffffffb8);
                if (bVar1) {
                  local_4 = PTY_USHORT;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_ffffffffffffffc4,
                                                      in_stack_ffffffffffffffc0),
                                          in_stack_ffffffffffffffb8);
                  if (bVar1) {
                    local_4 = PTY_INT;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_ffffffffffffffc4,
                                                        in_stack_ffffffffffffffc0),
                                            in_stack_ffffffffffffffb8);
                    if (bVar1) {
                      local_4 = PTY_INT;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_ffffffffffffffc4,
                                                          in_stack_ffffffffffffffc0),
                                              in_stack_ffffffffffffffb8);
                      if (bVar1) {
                        local_4 = PTY_UINT;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT44(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0),
                                                in_stack_ffffffffffffffb8);
                        if (bVar1) {
                          local_4 = PTY_UINT;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_ffffffffffffffc4,
                                                             in_stack_ffffffffffffffc0),
                                                  in_stack_ffffffffffffffb8);
                          if (bVar1) {
                            local_4 = PTY_FLOAT;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_ffffffffffffffc4,
                                                             in_stack_ffffffffffffffc0),
                                                  in_stack_ffffffffffffffb8);
                            if (bVar1) {
                              local_4 = PTY_FLOAT;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_ffffffffffffffc4,
                                                             in_stack_ffffffffffffffc0),
                                                  in_stack_ffffffffffffffb8);
                              if (!bVar1) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(in_stack_00000008,unaff_retaddr);
                                std::runtime_error::runtime_error(this,local_30);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              local_4 = PTY_DOUBLE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

Type::Tag typeTagOfString(const std::string& ty) {
      if (ty == "char") return Type::PTY_CHAR;
      if (ty == "int8") return Type::PTY_CHAR;
      if (ty == "uchar") return Type::PTY_UCHAR;
      if (ty == "uint8") return Type::PTY_UCHAR;
      if (ty == "short") return Type::PTY_SHORT;
      if (ty == "int16") return Type::PTY_SHORT;
      if (ty == "ushort") return Type::PTY_USHORT;
      if (ty == "uint16") return Type::PTY_USHORT;
      if (ty == "int") return Type::PTY_INT;
      if (ty == "int32") return Type::PTY_INT;
      if (ty == "uint") return Type::PTY_UINT;
      if (ty == "uint32") return Type::PTY_UINT;
      if (ty == "float") return Type::PTY_FLOAT;
      if (ty == "float32") return Type::PTY_FLOAT;
      if (ty == "double") return Type::PTY_DOUBLE;
      throw std::runtime_error("invalid type " + ty);
      return Type::PTY_NONE;
    }